

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.h
# Opt level: O0

void __thiscall imrt::Plan::~Plan(Plan *this)

{
  Plan *in_RDI;
  
  ~Plan(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~Plan() {}